

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O2

void __thiscall OptionRecord::~OptionRecord(OptionRecord *this)

{
  this->_vptr_OptionRecord = (_func_int **)&PTR__OptionRecord_00432ce8;
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~OptionRecord() {}